

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprandomurandom.cpp
# Opt level: O2

int __thiscall jrtplib::RTPRandomURandom::Init(RTPRandomURandom *this)

{
  int iVar1;
  FILE *pFVar2;
  
  if (this->device != (FILE *)0x0) {
    return -0x89;
  }
  pFVar2 = fopen("/dev/urandom","rb");
  this->device = (FILE *)pFVar2;
  iVar1 = -0x88;
  if (pFVar2 != (FILE *)0x0) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPRandomURandom::Init()
{
	if (device)
		return ERR_RTP_RTPRANDOMURANDOM_ALREADYOPEN;

	device = fopen("/dev/urandom","rb");
	if (device == 0)
		return ERR_RTP_RTPRANDOMURANDOM_CANTOPEN;

	return 0;
}